

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::NetworkUpdateParameters::_InternalSerialize
          (NetworkUpdateParameters *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  Type *this_00;
  ulong uVar2;
  int iVar3;
  int index;
  Optimizer *this_01;
  BoolParameter *this_02;
  Int64Parameter *pIVar4;
  size_t __n;
  uint8_t *puVar5;
  
  iVar3 = (this->losslayers_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (&(this->losslayers_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar1;
      if (uVar1 < 0x80) {
        puVar5 = target + 2;
      }
      else {
        puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                           (uVar1,target + 1);
      }
      target = LossLayer::_InternalSerialize(this_00,puVar5,stream);
      index = index + 1;
    } while (iVar3 != index);
  }
  this_01 = this->optimizer_;
  if (this != (NetworkUpdateParameters *)_NetworkUpdateParameters_default_instance_ &&
      this_01 != (Optimizer *)0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      this_01 = this->optimizer_;
    }
    *target = '\x12';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = Optimizer::_InternalSerialize(this_01,puVar5,stream);
  }
  pIVar4 = this->epochs_;
  if (pIVar4 != (Int64Parameter *)0x0 &&
      this != (NetworkUpdateParameters *)_NetworkUpdateParameters_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pIVar4 = this->epochs_;
    }
    *target = '\x1a';
    uVar1 = (pIVar4->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = Int64Parameter::_InternalSerialize(pIVar4,puVar5,stream);
  }
  this_02 = this->shuffle_;
  if (this_02 != (BoolParameter *)0x0 &&
      this != (NetworkUpdateParameters *)_NetworkUpdateParameters_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      this_02 = this->shuffle_;
    }
    *target = 'R';
    uVar1 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = BoolParameter::_InternalSerialize(this_02,puVar5,stream);
  }
  pIVar4 = this->seed_;
  if (pIVar4 != (Int64Parameter *)0x0 &&
      this != (NetworkUpdateParameters *)_NetworkUpdateParameters_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pIVar4 = this->seed_;
    }
    target[0] = 0xa2;
    target[1] = '\x01';
    uVar1 = (pIVar4->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar5 = target + 3;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 2);
    }
    target = Int64Parameter::_InternalSerialize(pIVar4,puVar5,stream);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = uVar2 & 0xfffffffffffffffc;
    data = *(void **)(uVar2 + 8);
    iVar3 = (int)*(undefined8 *)(uVar2 + 0x10);
    __n = (size_t)iVar3;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,iVar3,target)
      ;
      return puVar5;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* NetworkUpdateParameters::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.NetworkUpdateParameters)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.LossLayer lossLayers = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_losslayers_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_losslayers(i), target, stream);
  }

  // .CoreML.Specification.Optimizer optimizer = 2;
  if (this->_internal_has_optimizer()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::optimizer(this), target, stream);
  }

  // .CoreML.Specification.Int64Parameter epochs = 3;
  if (this->_internal_has_epochs()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::epochs(this), target, stream);
  }

  // .CoreML.Specification.BoolParameter shuffle = 10;
  if (this->_internal_has_shuffle()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        10, _Internal::shuffle(this), target, stream);
  }

  // .CoreML.Specification.Int64Parameter seed = 20;
  if (this->_internal_has_seed()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        20, _Internal::seed(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.NetworkUpdateParameters)
  return target;
}